

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

string * __thiscall cmGlobalGenerator::GetRealPath(cmGlobalGenerator *this,string *dir)

{
  int iVar1;
  iterator __pos;
  _Rb_tree_header *__y;
  string local_40;
  
  __y = &(this->RealPaths)._M_t._M_impl.super__Rb_tree_header;
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_lower_bound(&(this->RealPaths)._M_t,
                           (_Link_type)
                           (this->RealPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                           &__y->_M_header,dir);
  if ((_Rb_tree_header *)__pos._M_node != __y) {
    iVar1 = std::__cxx11::string::compare((string *)dir);
    if (-1 < iVar1) goto LAB_0023f216;
  }
  cmsys::SystemTools::GetRealPath(&local_40,dir,(string *)0x0);
  __pos = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_hint_unique<std::__cxx11::string_const&,std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->RealPaths,__pos._M_node,dir,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
LAB_0023f216:
  return (string *)(__pos._M_node + 2);
}

Assistant:

const std::string& cmGlobalGenerator::GetRealPath(const std::string& dir)
{
  auto i = this->RealPaths.lower_bound(dir);
  if (i == this->RealPaths.end() ||
      this->RealPaths.key_comp()(dir, i->first)) {
    i = this->RealPaths.emplace_hint(i, dir, cmSystemTools::GetRealPath(dir));
  }
  return i->second;
}